

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::EdgeChainSimplifier::AssignDegenerateEdges
          (EdgeChainSimplifier *this,vector<int,_std::allocator<int>_> *degenerate_ids,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *merged_ids)

{
  pointer pvVar1;
  InputEdgeId *pIVar2;
  int iVar3;
  int iVar4;
  pointer puVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __i;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  pointer puVar8;
  vector<int,_std::allocator<int>_> *ids;
  pointer pvVar9;
  long lVar10;
  long lVar11;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  InputEdgeId *pIVar12;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *merged_ids_local;
  InputEdgeId degenerate_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  S2LogMessage local_40;
  
  pvVar1 = (merged_ids->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  merged_ids_local = merged_ids;
  for (pvVar9 = (merged_ids->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar1; pvVar9 = pvVar9 + 1) {
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&order,((long)(merged_ids->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(merged_ids->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  lVar10 = 8;
  for (uVar7 = 0;
      puVar8 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,
      puVar5 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      pvVar9 = (merged_ids->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(merged_ids->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9) / 0x18);
      uVar7 = uVar7 + 1) {
    if (*(long *)((long)pvVar9 + lVar10 + -8) !=
        *(long *)((long)&(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar10)) {
      local_40.severity_ = (LogSeverity)uVar7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&order,&local_40.severity_);
    }
    lVar10 = lVar10 + 0x18;
  }
  if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar7 = lVar11 >> 2;
    lVar10 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(std::vector<int,std::allocator<int>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)const::__0>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1807:41)>
                )&merged_ids_local);
    if (lVar11 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(std::vector<int,std::allocator<int>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)const::__0>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )puVar5,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           )puVar8,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1807:41)>
                  )&merged_ids_local);
    }
    else {
      __last._M_current = puVar5 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(std::vector<int,std::allocator<int>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)const::__0>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )puVar5,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1807:41)>
                  )&merged_ids_local);
      for (; __last._M_current != puVar8; __last._M_current = __last._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(std::vector<int,std::allocator<int>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)const::__0>>
                  (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1807:41)>
                           )&merged_ids_local);
      }
    }
  }
  pIVar12 = (degenerate_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = (degenerate_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pIVar12 == pIVar2) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return;
    }
    degenerate_id = *pIVar12;
    iVar3 = input_edge_layer(this,degenerate_id);
    puVar5 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    while (uVar6 = uVar7, 0 < (long)uVar6) {
      uVar7 = uVar6 >> 1;
      if (*(merged_ids_local->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[puVar5[uVar7]].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start <=
          degenerate_id) {
        puVar5 = puVar5 + uVar7 + 1;
        uVar7 = ~uVar7 + uVar6;
      }
    }
    pvVar9 = (merged_ids_local->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar8 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((puVar5 != order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start) &&
       (puVar8 = puVar5 + -1,
       *pvVar9[puVar5[-1]].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start <
       (this->layer_begins_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[iVar3])) {
      puVar8 = puVar5;
    }
    iVar4 = input_edge_layer(this,*pvVar9[*puVar8].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (iVar3 != iVar4) break;
    std::vector<int,_std::allocator<int>_>::push_back
              ((merged_ids_local->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + *puVar8,&degenerate_id);
    pIVar12 = pIVar12 + 1;
  }
  S2LogMessage::S2LogMessage
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x721,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_40.stream_,
                  "Check failed: (layer) == (input_edge_layer((*merged_ids)[it[0]][0])) ");
  abort();
}

Assistant:

void S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(
    const vector<InputEdgeId>& degenerate_ids,
    vector<vector<InputEdgeId>>* merged_ids) const {
  // Each degenerate edge is assigned to an output edge in the appropriate
  // layer.  If there is more than one candidate, we use heuristics so that if
  // the input consists of a chain of edges provided in consecutive order
  // (some of which became degenerate), then all those input edges are
  // assigned to the same output edge.  For example, suppose that one output
  // edge is labeled with input edges 3,4,7,8, while another output edge is
  // labeled with input edges 50,51,54,57.  Then if we encounter degenerate
  // edges labeled with input edges 5 and 6, we would prefer to assign them to
  // the first edge (yielding the continuous range 3,4,5,6,7,8).
  //
  // The heuristic below is only smart enough to handle the case where the
  // candidate output edges have non-overlapping ranges of input edges.
  // (Otherwise there is probably not a good heuristic for assigning the
  // degenerate edges in any case.)

  // Duplicate edge ids don't affect the heuristic below, so we don't bother
  // removing them.  (They will be removed by IdSetLexicon::Add.)
  for (auto& ids : *merged_ids) std::sort(ids.begin(), ids.end());

  // Sort the output edges by their minimum input edge id.  This is sufficient
  // for the purpose of determining which layer they belong to.  With
  // EdgeType::UNDIRECTED, some edges might not have any input edge ids (i.e.,
  // if they consist entirely of siblings of input edges).  We simply remove
  // such edges from the lists of candidates.
  vector<unsigned> order;
  order.reserve(merged_ids->size());
  for (int i = 0; i < merged_ids->size(); ++i) {
    if (!(*merged_ids)[i].empty()) order.push_back(i);
  }
  std::sort(order.begin(), order.end(), [&merged_ids](int i, int j) {
      return (*merged_ids)[i][0] < (*merged_ids)[j][0];
    });

  // Now determine where each degenerate edge should be assigned.
  for (InputEdgeId degenerate_id : degenerate_ids) {
    int layer = input_edge_layer(degenerate_id);

    // Find the first output edge whose range of input edge ids starts after
    // "degenerate_id".  If the previous edge belongs to the correct layer,
    // then we assign the degenerate edge to it.
    auto it = std::upper_bound(order.begin(), order.end(), degenerate_id,
                               [&merged_ids](InputEdgeId x, unsigned y) {
                                 return x < (*merged_ids)[y][0];
                               });
    if (it != order.begin()) {
      if ((*merged_ids)[it[-1]][0] >= layer_begins_[layer]) --it;
    }
    S2_DCHECK_EQ(layer, input_edge_layer((*merged_ids)[it[0]][0]));
    (*merged_ids)[it[0]].push_back(degenerate_id);
  }
}